

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11GlxPlatform.cpp
# Opt level: O0

int __thiscall tcu::x11::glx::GlxVisual::getAttrib(GlxVisual *this,int attribute)

{
  int iVar1;
  Display *pDVar2;
  int local_18;
  int local_14;
  int fbvalue;
  int attribute_local;
  GlxVisual *this_local;
  
  local_14 = attribute;
  _fbvalue = this;
  pDVar2 = getXDisplay(this);
  iVar1 = glXGetFBConfigAttrib(pDVar2,this->m_fbConfig,local_14,&local_18);
  checkGLX<bool>(iVar1 == 0,"glXGetFBConfigAttrib(getXDisplay(), m_fbConfig, attribute, &fbvalue)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/platform/X11/tcuX11GlxPlatform.cpp"
                 ,0x127);
  return local_18;
}

Assistant:

int GlxVisual::getAttrib (int attribute)
{
	int fbvalue;
	TCU_CHECK_GLX_CONFIG(glXGetFBConfigAttrib(getXDisplay(), m_fbConfig, attribute, &fbvalue));
	return fbvalue;
}